

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall
discordpp::ThreadMetadata::ThreadMetadata
          (ThreadMetadata *this,field<bool> *archived,field<int> *auto_archive_duration,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *archive_timestamp,field<bool> *locked,omittable_field<bool> *invitable,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *create_timestamp)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  _Head_base<0UL,_int_*,_false> _Var2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  _Head_base<0UL,_int_*,_false> _Var4;
  pointer *__ptr;
  
  _Var1._M_head_impl =
       (archived->t_)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (bool *)0x0) {
    _Var3._M_head_impl = (bool *)0x0;
  }
  else {
    _Var3._M_head_impl = (bool *)operator_new(1);
    *_Var3._M_head_impl = *_Var1._M_head_impl;
  }
  (this->archived).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false> =
       (_Head_base<0UL,_bool_*,_false>)_Var3._M_head_impl;
  (this->archived).s_ = archived->s_;
  _Var2._M_head_impl =
       (auto_archive_duration->t_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    _Var4._M_head_impl = (int *)0x0;
  }
  else {
    _Var4._M_head_impl = (int *)operator_new(4);
    *_Var4._M_head_impl = *_Var2._M_head_impl;
  }
  (this->auto_archive_duration).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var4._M_head_impl;
  (this->auto_archive_duration).s_ = auto_archive_duration->s_;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->archive_timestamp,archive_timestamp);
  _Var1._M_head_impl =
       (locked->t_)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (bool *)0x0) {
    _Var3._M_head_impl = (bool *)0x0;
  }
  else {
    _Var3._M_head_impl = (bool *)operator_new(1);
    *_Var3._M_head_impl = *_Var1._M_head_impl;
  }
  (this->locked).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var3._M_head_impl;
  (this->locked).s_ = locked->s_;
  _Var1._M_head_impl =
       (invitable->super_field<bool>).t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (bool *)0x0) {
    _Var3._M_head_impl = (bool *)0x0;
  }
  else {
    _Var3._M_head_impl = (bool *)operator_new(1);
    *_Var3._M_head_impl = *_Var1._M_head_impl;
  }
  (this->invitable).super_field<bool>.t_._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var3._M_head_impl;
  (this->invitable).super_field<bool>.s_ = (invitable->super_field<bool>).s_;
  (this->invitable)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->create_timestamp).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&create_timestamp->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->create_timestamp)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024a2b0;
  return;
}

Assistant:

ThreadMetadata(
        field<bool> archived = uninitialized,
        field<int> auto_archive_duration = uninitialized,
        field<Timestamp> archive_timestamp = uninitialized,
        field<bool> locked = uninitialized,
        omittable_field<bool> invitable = omitted,
        nullable_omittable_field<Timestamp> create_timestamp = omitted
    ):
        archived(archived),
        auto_archive_duration(auto_archive_duration),
        archive_timestamp(archive_timestamp),
        locked(locked),
        invitable(invitable),
        create_timestamp(create_timestamp)
    {}